

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlDocGetRootElement(xmlDoc *doc)

{
  xmlDoc *local_20;
  xmlNodePtr ret;
  xmlDoc *doc_local;
  
  if (doc == (xmlDoc *)0x0) {
    doc_local = (xmlDoc *)0x0;
  }
  else {
    for (local_20 = (xmlDoc *)doc->children; local_20 != (xmlDoc *)0x0;
        local_20 = (xmlDoc *)local_20->next) {
      if (local_20->type == XML_ELEMENT_NODE) {
        return (xmlNodePtr)local_20;
      }
    }
    doc_local = local_20;
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlDocGetRootElement(const xmlDoc *doc) {
    xmlNodePtr ret;

    if (doc == NULL) return(NULL);
    ret = doc->children;
    while (ret != NULL) {
	if (ret->type == XML_ELEMENT_NODE)
	    return(ret);
        ret = ret->next;
    }
    return(ret);
}